

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::MonitorTask::checkArguments
          (MonitorTask *this,ASTContext *context,Args *args,SourceRange range,Expression *iterOrThis
          )

{
  Compilation *pCVar1;
  Type *this_00;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_01;
  bool bVar4;
  Type *pTVar5;
  long lVar6;
  MonitorVisitor visitor;
  MonitorVisitor local_30;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = FmtHelpers::checkDisplayArgs(context,args);
  this_00 = pCVar1->scalarTypeTable[(ulong)!bVar4 + 0x10];
  pTVar5 = this_00->canonical;
  if (pTVar5 == (Type *)0x0) {
    Type::resolveCanonical(this_00);
    pTVar5 = this_00->canonical;
  }
  if ((pTVar5->super_Symbol).kind != ErrorType) {
    sVar2 = (args->_M_extent)._M_extent_value;
    if (sVar2 != 0) {
      ppEVar3 = args->_M_ptr;
      lVar6 = 0;
      local_30.context = context;
      do {
        this_01 = *(Expression **)((long)ppEVar3 + lVar6);
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                  (this_01,this_01,&local_30);
        lVar6 = lVar6 + 8;
      } while (sVar2 << 3 != lVar6);
    }
  }
  return this_00;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = DisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args)
            arg->visit(visitor);

        return result;
    }